

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestLexer.cpp
# Opt level: O2

void __thiscall TestLexer_TestString_Test::TestBody(TestLexer_TestString_Test *this)

{
  allocator<char> local_a1;
  string local_a0;
  string local_80;
  undefined1 local_60 [40];
  Lexer lexer;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"\"Hi, this is a string.\"",&local_a1);
  Lexer::Lexer(&lexer,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  Lexer::getToken((Token *)local_60,&lexer);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"Hi, this is a string.",(allocator<char> *)&local_a0);
  checkToken((Token *)local_60,String,1,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)(local_60 + 8));
  std::__cxx11::string::~string((string *)&lexer);
  return;
}

Assistant:

TEST(TestLexer, TestString) {
    Lexer lexer("\"Hi, this is a string.\"");
    checkToken(lexer.getToken(), TokenType::String, 1, "Hi, this is a string.");
}